

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz_encoder_mf.c
# Opt level: O1

uint32_t lzma_mf_hc4_find(lzma_mf *mf,lzma_match *matches)

{
  uint8_t *cur;
  uint32_t uVar1;
  uint32_t cur_match;
  uint8_t *puVar2;
  uint32_t *puVar3;
  uint uVar4;
  lzma_match *plVar5;
  uint uVar6;
  ulong uVar7;
  uint32_t pos;
  uint len_limit;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  uint32_t uVar12;
  ulong uVar13;
  
  uVar4 = mf->read_pos;
  uVar6 = mf->write_pos - uVar4;
  len_limit = mf->nice_len;
  if ((uVar6 < mf->nice_len) && (len_limit = uVar6, uVar6 < 4)) {
    if (mf->action != LZMA_RUN) {
      move_pending(mf);
      return 0;
    }
    __assert_fail("mf->action != LZMA_RUN",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Utilities/cmliblzma/liblzma/lz/lz_encoder_mf.c"
                  ,0x170,"uint32_t lzma_mf_hc4_find(lzma_mf *, lzma_match *)");
  }
  puVar2 = mf->buffer;
  puVar3 = mf->hash;
  cur = puVar2 + uVar4;
  pos = mf->offset + uVar4;
  uVar9 = (uint)puVar2[(ulong)uVar4 + 1] ^ lzma_crc32_table[0][puVar2[uVar4]];
  uVar8 = (uint)puVar2[(ulong)uVar4 + 2] << 8 ^ uVar9;
  uVar9 = uVar9 & 0x3ff;
  uVar13 = (ulong)(uVar8 & 0xffff);
  uVar12 = puVar3[uVar9];
  uVar6 = pos - uVar12;
  uVar1 = puVar3[uVar13 + 0x400];
  uVar4 = ((lzma_crc32_table[0][puVar2[(ulong)uVar4 + 3]] << 5 ^ uVar8) & mf->hash_mask) + 0x10400;
  cur_match = puVar3[uVar4];
  puVar3[uVar9] = pos;
  puVar3[uVar13 + 0x400] = pos;
  puVar3[uVar4] = pos;
  uVar4 = mf->cyclic_size;
  uVar8 = 1;
  uVar13 = 0;
  if ((uVar6 < uVar4) && (cur[-(ulong)uVar6] == *cur)) {
    matches->len = 2;
    matches->dist = uVar6 - 1;
    uVar8 = 2;
    uVar13 = 1;
  }
  if (((uVar1 != uVar12) && (uVar9 = pos - uVar1, uVar9 < uVar4)) && (cur[-(ulong)uVar9] == *cur)) {
    matches[uVar13].dist = uVar9 - 1;
    uVar8 = 3;
    uVar13 = (ulong)((int)uVar13 + 1);
    uVar6 = uVar9;
  }
  uVar12 = (uint32_t)uVar13;
  if (uVar12 != 0) {
    if (len_limit < uVar8) {
      __assert_fail("len <= limit",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Utilities/cmliblzma/liblzma/common/memcmplen.h"
                    ,0x2e,
                    "uint32_t lzma_memcmplen(const uint8_t *, const uint8_t *, uint32_t, uint32_t)")
      ;
    }
    if ((int)len_limit < 0) {
      __assert_fail("limit <= UINT32_MAX / 2",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Utilities/cmliblzma/liblzma/common/memcmplen.h"
                    ,0x2f,
                    "uint32_t lzma_memcmplen(const uint8_t *, const uint8_t *, uint32_t, uint32_t)")
      ;
    }
    uVar10 = (ulong)uVar6;
    do {
      uVar1 = len_limit;
      if (len_limit <= uVar8) break;
      uVar11 = (ulong)uVar8;
      uVar7 = *(long *)(cur + (uVar11 - uVar6)) - *(long *)(cur + uVar11);
      if (uVar7 == 0) {
        uVar8 = uVar8 + 8;
      }
      else {
        uVar10 = 0;
        if (uVar7 != 0) {
          for (; (uVar7 >> uVar10 & 1) == 0; uVar10 = uVar10 + 1) {
          }
        }
        uVar8 = ((uint)(uVar10 >> 3) & 0x1fffffff) + uVar8;
        uVar9 = len_limit;
        if (uVar8 < len_limit) {
          uVar9 = uVar8;
        }
        uVar10 = (ulong)uVar9;
      }
      uVar1 = (uint32_t)uVar10;
    } while (*(long *)(cur + (uVar11 - uVar6)) == *(long *)(cur + uVar11));
    uVar8 = uVar1;
    matches[uVar13 - 1].len = uVar8;
    if (uVar8 == len_limit) {
      mf->son[mf->cyclic_pos] = cur_match;
      goto LAB_00422571;
    }
  }
  uVar12 = 3;
  if (3 < uVar8) {
    uVar12 = uVar8;
  }
  plVar5 = hc_find_func(len_limit,pos,cur,cur_match,mf->depth,mf->son,mf->cyclic_pos,uVar4,
                        matches + uVar13,uVar12);
  uVar12 = (uint32_t)((ulong)((long)plVar5 - (long)matches) >> 3);
LAB_00422571:
  move_pos(mf);
  return uVar12;
}

Assistant:

extern uint32_t
lzma_mf_hc4_find(lzma_mf *mf, lzma_match *matches)
{
	header_find(false, 4);

	hash_4_calc();

	uint32_t delta2 = pos - mf->hash[hash_2_value];
	const uint32_t delta3
			= pos - mf->hash[FIX_3_HASH_SIZE + hash_3_value];
	const uint32_t cur_match = mf->hash[FIX_4_HASH_SIZE + hash_value];

	mf->hash[hash_2_value ] = pos;
	mf->hash[FIX_3_HASH_SIZE + hash_3_value] = pos;
	mf->hash[FIX_4_HASH_SIZE + hash_value] = pos;

	uint32_t len_best = 1;

	if (delta2 < mf->cyclic_size && *(cur - delta2) == *cur) {
		len_best = 2;
		matches[0].len = 2;
		matches[0].dist = delta2 - 1;
		matches_count = 1;
	}

	if (delta2 != delta3 && delta3 < mf->cyclic_size
			&& *(cur - delta3) == *cur) {
		len_best = 3;
		matches[matches_count++].dist = delta3 - 1;
		delta2 = delta3;
	}

	if (matches_count != 0) {
		len_best = lzma_memcmplen(cur - delta2, cur,
				len_best, len_limit);

		matches[matches_count - 1].len = len_best;

		if (len_best == len_limit) {
			hc_skip();
			return matches_count;
		}
	}

	if (len_best < 3)
		len_best = 3;

	hc_find(len_best);
}